

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

CharSetNode * __thiscall
UnifiedRegex::CharSetFull::ClearRange
          (CharSetFull *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CharSetNode *toReturn;
  uint h_local;
  uint l_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetFull *this_local;
  
  uVar3 = CharSetNode::lim(level);
  if (uVar3 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0xec,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0xed,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((l == 0) && (uVar3 = CharSetNode::lim(level), h == uVar3)) {
    this_local = (CharSetFull *)0x0;
  }
  else {
    this_local = (CharSetFull *)CharSetNode::For(allocator,level);
    if ((l != 0) &&
       (iVar4 = (*((CharSetNode *)this_local)->_vptr_CharSetNode[2])
                          (this_local,allocator,(ulong)level,0,(ulong)(l - 1)),
       (CharSetNode *)CONCAT44(extraout_var,iVar4) != (CharSetNode *)this_local)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0xf7,"(toReturn->Set(allocator, level, 0, l - 1) == toReturn)",
                         "toReturn->Set(allocator, level, 0, l - 1) == toReturn");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    uVar3 = CharSetNode::lim(level);
    if (h < uVar3) {
      uVar3 = CharSetNode::lim(level);
      iVar4 = (*((CharSetNode *)this_local)->_vptr_CharSetNode[2])
                        (this_local,allocator,(ulong)level,(ulong)(h + 1),(ulong)uVar3);
      if ((CharSetNode *)CONCAT44(extraout_var_00,iVar4) != (CharSetNode *)this_local) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0xfc,"(toReturn->Set(allocator, level, h + 1, lim(level)) == toReturn)",
                           "toReturn->Set(allocator, level, h + 1, lim(level)) == toReturn");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  return &this_local->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetFull::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        CharSetNode* toReturn = For(allocator, level);

        if (l > 0)
        {
            AssertVerify(toReturn->Set(allocator, level, 0, l - 1) == toReturn);
        }

        if (h < lim(level))
        {
            AssertVerify(toReturn->Set(allocator, level, h + 1, lim(level)) == toReturn);
        }

        return toReturn;
    }